

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int32 solve(float32 **a,float32 *b,float32 *out_x,int32 n)

{
  integer *n_00;
  integer local_40;
  int local_3c;
  int32 nrhs;
  int32 info;
  float32 **tmp_a;
  char uplo;
  float32 *pfStack_28;
  int32 n_local;
  float32 *out_x_local;
  float32 *b_local;
  float32 **a_local;
  
  tmp_a._4_4_ = n;
  pfStack_28 = out_x;
  out_x_local = b;
  b_local = (float32 *)a;
  _nrhs = (undefined8 *)
          __ckd_calloc_2d__((long)n,(long)n,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/matrix.c"
                            ,0xba);
  memcpy((void *)*_nrhs,*(void **)b_local,(long)(tmp_a._4_4_ * tmp_a._4_4_) << 2);
  memcpy(pfStack_28,out_x_local,(long)tmp_a._4_4_ << 2);
  tmp_a._3_1_ = 0x4c;
  local_40 = 1;
  n_00 = (integer *)((long)&tmp_a + 4);
  sposv_((char *)((long)&tmp_a + 3),n_00,&local_40,(real *)*_nrhs,n_00,(real *)pfStack_28,n_00,
         &local_3c);
  ckd_free_2d(_nrhs);
  if (local_3c == 0) {
    a_local._4_4_ = local_3c;
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

int32
solve(float32 **a, /*Input : an n*n matrix A */
      float32 *b,  /*Input : a n dimesion vector b */
      float32 *out_x,  /*Output : a n dimesion vector x */
      int32   n)
{
    char uplo;
    float32 **tmp_a;
    int32 info, nrhs;

    /* a is assumed to be symmetric, so we don't need to switch the
     * ordering of the data.  But we do need to copy it since it is
     * overwritten by LAPACK. */
    tmp_a = (float32 **)ckd_calloc_2d(n, n, sizeof(float32));
    memcpy(tmp_a[0], a[0], n*n*sizeof(float32));
    memcpy(out_x, b, n*sizeof(float32));
    uplo = 'L';
    nrhs = 1;
    sposv_(&uplo, &n, &nrhs, tmp_a[0], &n, out_x, &n, &info);
    ckd_free_2d((void **)tmp_a);

    if (info != 0)
	return -1;
    else
	return info;
}